

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall FileReaderZ::Read(FileReaderZ *this,void *buffer,long len)

{
  int iVar1;
  bool bVar2;
  int err;
  long len_local;
  void *buffer_local;
  FileReaderZ *this_local;
  
  (this->Stream).next_out = (Bytef *)buffer;
  (this->Stream).avail_out = (uInt)len;
  do {
    iVar1 = inflate(&this->Stream,2);
    if (((this->Stream).avail_in == 0) && ((this->SawEOF & 1U) == 0)) {
      FillBuffer(this);
    }
    bVar2 = false;
    if (iVar1 == 0) {
      bVar2 = (this->Stream).avail_out != 0;
    }
  } while (bVar2);
  if ((iVar1 != 0) && (iVar1 != 1)) {
    I_Error("Corrupt zlib stream");
  }
  if ((this->Stream).avail_out != 0) {
    I_Error("Ran out of data in zlib stream");
  }
  return len - (ulong)(this->Stream).avail_out;
}

Assistant:

long FileReaderZ::Read (void *buffer, long len)
{
	int err;

	Stream.next_out = (Bytef *)buffer;
	Stream.avail_out = len;

	do
	{
		err = inflate (&Stream, Z_SYNC_FLUSH);
		if (Stream.avail_in == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == Z_OK && Stream.avail_out != 0);

	if (err != Z_OK && err != Z_STREAM_END)
	{
		I_Error ("Corrupt zlib stream");
	}

	if (Stream.avail_out != 0)
	{
		I_Error ("Ran out of data in zlib stream");
	}

	return len - Stream.avail_out;
}